

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Maybe<kj::String> * __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryReadlink
          (Maybe<kj::String> *__return_storage_ptr__,InMemoryDirectory *this,PathPtr path)

{
  long lVar1;
  size_t sVar2;
  String *pSVar3;
  char *size;
  char *pcVar4;
  char *value;
  StringPtr name;
  StringPtr name_00;
  Fault f;
  undefined1 local_40 [24];
  
  sVar2 = path.parts.size_;
  pSVar3 = path.parts.ptr;
  if (sVar2 == 1) {
    local_40[0] = 0;
    _::Mutex::lock(&(this->impl).mutex,1);
    if ((pSVar3->content).size_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (pSVar3->content).ptr;
    }
    name.content.size_ = (size_t)pcVar4;
    name.content.ptr = (char *)&(this->impl).value;
    Impl::tryGetEntry((Impl *)local_40,name);
    lVar1 = CONCAT71(local_40._1_7_,local_40[0]);
    if (lVar1 == 0) {
      (__return_storage_ptr__->ptr).isSet = false;
    }
    else if (*(int *)(lVar1 + 0x18) == 3) {
      pcVar4 = *(char **)(lVar1 + 0x30);
      value = pcVar4;
      if (pcVar4 != (char *)0x0) {
        value = *(char **)(lVar1 + 0x28);
      }
      size = (char *)0x0;
      if (pcVar4 != (char *)0x0) {
        size = pcVar4 + -1;
      }
      heapString((String *)local_40,value,(size_t)size);
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.content.ptr =
           (char *)CONCAT71(local_40._1_7_,local_40[0]);
      (__return_storage_ptr__->ptr).field_1.value.content.size_ = local_40._8_8_;
      (__return_storage_ptr__->ptr).field_1.value.content.disposer =
           (ArrayDisposer *)local_40._16_8_;
    }
    else {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[14]>
                ((Fault *)local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x6a8,FAILED,(char *)0x0,"\"not a symlink\"",(char (*) [14])"not a symlink");
      (__return_storage_ptr__->ptr).isSet = false;
      _::Debug::Fault::~Fault((Fault *)local_40);
    }
    _::Mutex::unlock(&(this->impl).mutex,SHARED,(Waiter *)0x0);
  }
  else if (sVar2 == 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[14]>
              ((Fault *)local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x45f,FAILED,(char *)0x0,"\"not a symlink\"",(char (*) [14])"not a symlink");
    (__return_storage_ptr__->ptr).isSet = false;
    _::Debug::Fault::~Fault((Fault *)local_40);
  }
  else {
    if ((pSVar3->content).size_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (pSVar3->content).ptr;
    }
    name_00.content.size_ = (size_t)pcVar4;
    name_00.content.ptr = (char *)this;
    tryGetParent((InMemoryDirectory *)local_40,name_00);
    if ((InMemoryFileFactory *)local_40._8_8_ == (InMemoryFileFactory *)0x0) {
      (__return_storage_ptr__->ptr).isSet = false;
    }
    else {
      (**(code **)(*(_func_int **)local_40._8_8_ + 0x60))
                (__return_storage_ptr__,local_40._8_8_,pSVar3 + 1,sVar2 - 1);
      (*(code *)**(undefined8 **)CONCAT71(local_40._1_7_,local_40[0]))
                ((undefined8 *)CONCAT71(local_40._1_7_,local_40[0]),
                 (InMemoryFileFactory *)
                 (local_40._8_8_ + *(long *)(*(_func_int **)local_40._8_8_ + -0x10)));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Maybe<String> tryReadlink(PathPtr path) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("not a symlink") { return kj::none; }
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_SOME(entry, lock->tryGetEntry(path[0])) {
        return asSymlink(lock, entry);
      } else {
        return kj::none;
      }
    }